

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_traversal_predictive_encoder.h
# Opt level: O3

void __thiscall
draco::MeshEdgebreakerTraversalPredictiveEncoder::~MeshEdgebreakerTraversalPredictiveEncoder
          (MeshEdgebreakerTraversalPredictiveEncoder *this)

{
  pointer piVar1;
  RAnsBitEncoder *__ptr;
  pointer pEVar2;
  BitEncoder *pBVar3;
  pointer pcVar4;
  
  std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
            (&(this->predictions_).super__Bvector_base<std::allocator<bool>_>);
  piVar1 = (this->vertex_valences_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1,(long)(this->vertex_valences_).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)piVar1);
  }
  __ptr = (this->super_MeshEdgebreakerTraversalEncoder).attribute_connectivity_encoders_._M_t.
          super___uniq_ptr_impl<draco::RAnsBitEncoder,_std::default_delete<draco::RAnsBitEncoder[]>_>
          ._M_t.
          super__Tuple_impl<0UL,_draco::RAnsBitEncoder_*,_std::default_delete<draco::RAnsBitEncoder[]>_>
          .super__Head_base<0UL,_draco::RAnsBitEncoder_*,_false>._M_head_impl;
  if (__ptr != (RAnsBitEncoder *)0x0) {
    std::default_delete<draco::RAnsBitEncoder[]>::operator()
              ((default_delete<draco::RAnsBitEncoder[]> *)
               &(this->super_MeshEdgebreakerTraversalEncoder).attribute_connectivity_encoders_,__ptr
              );
  }
  (this->super_MeshEdgebreakerTraversalEncoder).attribute_connectivity_encoders_._M_t.
  super___uniq_ptr_impl<draco::RAnsBitEncoder,_std::default_delete<draco::RAnsBitEncoder[]>_>._M_t.
  super__Tuple_impl<0UL,_draco::RAnsBitEncoder_*,_std::default_delete<draco::RAnsBitEncoder[]>_>.
  super__Head_base<0UL,_draco::RAnsBitEncoder_*,_false>._M_head_impl = (RAnsBitEncoder *)0x0;
  pEVar2 = (this->super_MeshEdgebreakerTraversalEncoder).symbols_.
           super__Vector_base<draco::EdgebreakerTopologyBitPattern,_std::allocator<draco::EdgebreakerTopologyBitPattern>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pEVar2 != (pointer)0x0) {
    operator_delete(pEVar2,(long)(this->super_MeshEdgebreakerTraversalEncoder).symbols_.
                                 super__Vector_base<draco::EdgebreakerTopologyBitPattern,_std::allocator<draco::EdgebreakerTopologyBitPattern>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pEVar2);
  }
  pBVar3 = (this->super_MeshEdgebreakerTraversalEncoder).traversal_buffer_.bit_encoder_._M_t.
           super___uniq_ptr_impl<draco::EncoderBuffer::BitEncoder,_std::default_delete<draco::EncoderBuffer::BitEncoder>_>
           ._M_t.
           super__Tuple_impl<0UL,_draco::EncoderBuffer::BitEncoder_*,_std::default_delete<draco::EncoderBuffer::BitEncoder>_>
           .super__Head_base<0UL,_draco::EncoderBuffer::BitEncoder_*,_false>._M_head_impl;
  if (pBVar3 != (BitEncoder *)0x0) {
    operator_delete(pBVar3,0x10);
  }
  (this->super_MeshEdgebreakerTraversalEncoder).traversal_buffer_.bit_encoder_._M_t.
  super___uniq_ptr_impl<draco::EncoderBuffer::BitEncoder,_std::default_delete<draco::EncoderBuffer::BitEncoder>_>
  ._M_t.
  super__Tuple_impl<0UL,_draco::EncoderBuffer::BitEncoder_*,_std::default_delete<draco::EncoderBuffer::BitEncoder>_>
  .super__Head_base<0UL,_draco::EncoderBuffer::BitEncoder_*,_false>._M_head_impl = (BitEncoder *)0x0
  ;
  pcVar4 = (this->super_MeshEdgebreakerTraversalEncoder).traversal_buffer_.buffer_.
           super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start;
  if (pcVar4 != (pointer)0x0) {
    operator_delete(pcVar4,(long)(this->super_MeshEdgebreakerTraversalEncoder).traversal_buffer_.
                                 buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pcVar4);
  }
  RAnsBitEncoder::~RAnsBitEncoder((RAnsBitEncoder *)this);
  return;
}

Assistant:

MeshEdgebreakerTraversalPredictiveEncoder()
      : corner_table_(nullptr),
        prev_symbol_(-1),
        num_split_symbols_(0),
        last_corner_(kInvalidCornerIndex),
        num_symbols_(0) {}